

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_mark.cc
# Opt level: O0

int main(int argc,char **argv)

{
  anon_class_8_1_8d211705 __unary_op;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  long in_RSI;
  int in_EDI;
  double dVar8;
  ostringstream error_message_18;
  int k_1;
  ostringstream error_message_17;
  double value;
  int k;
  double phase;
  double multiplier;
  double sum_f0;
  int j_1;
  int next_pitch_mark_1;
  int i_1;
  int n;
  ostringstream error_message_16;
  ostringstream error_message_15;
  ostringstream error_message_14;
  int j;
  int i;
  int next_pitch_mark;
  int num_pitch_marks;
  int waveform_length;
  double binary_polarity;
  ostringstream error_message_13;
  ostringstream error_message_12;
  Polarity polarity;
  vector<double,_std::allocator<double>_> pitch_mark;
  vector<double,_std::allocator<double>_> f0;
  bool waveform_output;
  double tmp_1;
  vector<double,_std::allocator<double>_> waveform;
  ostringstream error_message_11;
  PitchExtraction pitch_extraction;
  istream *input_stream;
  ostringstream error_message_10;
  ifstream ifs;
  ostringstream error_message_9;
  char *input_file;
  ostringstream error_message_8;
  int num_input_files;
  ostringstream error_message_7;
  ostringstream error_message_6;
  double sampling_rate_in_hz;
  ostringstream error_message_5;
  ostringstream error_message_4;
  int tmp;
  int max_1;
  int min_1;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  double max;
  double min;
  int option_char;
  double unvoiced_value;
  OutputFormats output_format;
  double voicing_threshold;
  double upper_f0;
  double lower_f0;
  double sampling_rate;
  option *in_stack_ffffffffffffda08;
  allocator *paVar9;
  undefined7 in_stack_ffffffffffffda10;
  undefined1 in_stack_ffffffffffffda17;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffda18;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffda20;
  undefined4 in_stack_ffffffffffffda28;
  undefined4 in_stack_ffffffffffffda2c;
  undefined4 in_stack_ffffffffffffda40;
  undefined4 in_stack_ffffffffffffda44;
  int iVar10;
  ostream *in_stack_ffffffffffffda48;
  undefined4 in_stack_ffffffffffffda50;
  Algorithms in_stack_ffffffffffffda54;
  double in_stack_ffffffffffffda58;
  int in_stack_ffffffffffffda60;
  undefined4 in_stack_ffffffffffffda64;
  double in_stack_ffffffffffffda68;
  undefined7 in_stack_ffffffffffffda70;
  undefined1 in_stack_ffffffffffffda77;
  int local_2588;
  int in_stack_ffffffffffffda7c;
  PitchExtraction *in_stack_ffffffffffffda80;
  bool local_254a;
  char *local_2538;
  char *local_24f0;
  byte local_245a;
  bool local_240a;
  ostringstream *in_stack_ffffffffffffdbf8;
  allocator *in_stack_ffffffffffffdc00;
  bool local_23da;
  allocator local_2369;
  string local_2368 [32];
  ostringstream local_2348 [376];
  int local_21d0;
  allocator local_21c9;
  string local_21c8 [32];
  ostringstream local_21a8 [376];
  double local_2030;
  int local_2024;
  double local_2020;
  string *local_2018;
  double *local_2010;
  double *local_2008;
  double *local_2000;
  double *local_1ff8;
  double local_1ff0;
  int local_1fe4;
  int local_1fe0;
  int local_1fdc;
  int local_1fd8;
  allocator local_1fd1;
  string local_1fd0 [32];
  ostringstream local_1fb0 [383];
  allocator local_1e31;
  string local_1e30 [32];
  ostringstream local_1e10 [383];
  allocator local_1c91;
  string local_1c90 [32];
  ostringstream local_1c70 [380];
  int local_1af4;
  int local_1af0;
  int local_1aec;
  int local_1ae8;
  int local_1ae4;
  undefined8 local_1ae0;
  allocator local_1ad1;
  string local_1ad0 [32];
  ostringstream local_1ab0 [376];
  double *local_1938;
  double local_1930;
  double *local_1928;
  double *local_1920;
  double *local_1918;
  allocator local_1909;
  string local_1908 [32];
  ostringstream local_18e8 [380];
  int local_176c;
  vector<double,_std::allocator<double>_> local_1768;
  vector<double,_std::allocator<double>_> local_1750;
  bool local_1731;
  vector<double,_std::allocator<double>_> local_1728;
  allocator local_1709;
  string local_1708 [32];
  ostringstream local_16e8 [392];
  char *local_1560;
  undefined4 local_1558;
  allocator local_1551;
  string local_1550 [32];
  ostringstream local_1530 [376];
  char local_13b8 [527];
  allocator local_11a9;
  string local_11a8 [32];
  ostringstream local_1188 [376];
  char *local_1010;
  allocator local_1001;
  string local_1000 [32];
  ostringstream local_fe0 [376];
  int local_e68;
  allocator local_e61;
  string local_e60 [32];
  ostringstream local_e40 [383];
  allocator local_cc1;
  string local_cc0 [32];
  ostringstream local_ca0 [376];
  double local_b28;
  allocator local_b19;
  string local_b18 [32];
  ostringstream local_af8 [383];
  allocator local_979;
  string local_978 [39];
  allocator local_951;
  string local_950 [32];
  ostringstream local_930 [383];
  allocator local_7b1;
  string local_7b0 [32];
  int local_790;
  undefined4 local_78c;
  undefined4 local_788;
  allocator local_781;
  string local_780 [32];
  ostringstream local_760 [383];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [32];
  ostringstream local_598 [383];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  ostringstream local_3d0 [383];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  ostringstream local_208 [399];
  allocator local_79;
  string local_78 [32];
  undefined8 local_58;
  undefined8 local_50;
  int local_44;
  undefined8 local_40;
  int local_34;
  undefined8 local_30;
  double local_28;
  double local_20;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_18 = 16.0;
  local_20 = 60.0;
  local_28 = 240.0;
  local_30 = 0x3feccccccccccccd;
  local_34 = 0;
  local_40 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_44 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffda20._M_current >> 0x20),
                                   (char **)in_stack_ffffffffffffda18._M_current,
                                   (char *)CONCAT17(in_stack_ffffffffffffda17,
                                                    in_stack_ffffffffffffda10),
                                   in_stack_ffffffffffffda08,(int *)0x104bdf), pcVar1 = ya_optarg,
        local_44 != -1) {
    switch(local_44) {
    case 0x48:
      in_stack_ffffffffffffdc00 = &local_419;
      in_stack_ffffffffffffdbf8 = (ostringstream *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_418,(char *)in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdc00);
      bVar3 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffda18._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      local_240a = !bVar3 || local_28 <= 0.0;
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      if (local_240a) {
        std::__cxx11::ostringstream::ostringstream(local_598);
        std::operator<<((ostream *)local_598,
                        "The argument for the -H option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b8,"pitch_mark",&local_5b9);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_5b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_598);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1b3c::PrintUsage
                ((ostream *)CONCAT44(in_stack_ffffffffffffda54,in_stack_ffffffffffffda50));
      return 1;
    case 0x4c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,pcVar1,&local_251);
      bVar3 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffda18._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      local_23da = !bVar3 || local_20 <= 10.0;
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      if (local_23da) {
        std::__cxx11::ostringstream::ostringstream(local_3d0);
        poVar5 = std::operator<<((ostream *)local_3d0,
                                 "The argument for the -L option must be a number ");
        std::operator<<(poVar5,"greater than 10");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f0,"pitch_mark",&local_3f1);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3d0);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_1b3c::PrintUsage
                ((ostream *)CONCAT44(in_stack_ffffffffffffda54,in_stack_ffffffffffffda50));
      return 0;
    case 0x6f:
      local_788 = 0;
      local_78c = 5;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7b0,pcVar1,&local_7b1);
      bVar3 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffda18._M_current,
                         (int *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      local_245a = 1;
      if (bVar3) {
        bVar3 = sptk::IsInRange(local_790,0,5);
        local_245a = bVar3 ^ 0xff;
      }
      std::__cxx11::string::~string(local_7b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
      if ((local_245a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_930);
        poVar5 = std::operator<<((ostream *)local_930,
                                 "The argument for the -o option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,5);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_950,"pitch_mark",&local_951);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_950);
        std::allocator<char>::~allocator((allocator<char> *)&local_951);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_930);
        return local_4;
      }
      local_34 = local_790;
      break;
    case 0x73:
      local_50 = 0x4018000000000000;
      local_58 = 0x4058800000000000;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar1,&local_79);
      bVar2 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffda18._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      bVar3 = true;
      if ((bVar2) && (bVar3 = true, 6.0 < local_18)) {
        bVar3 = 98.0 < local_18;
      }
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_208);
        poVar5 = std::operator<<((ostream *)local_208,
                                 "The argument for the -s option must be a number ");
        poVar5 = std::operator<<(poVar5,"in the interval (");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,6.0);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,98.0);
        std::operator<<(poVar5,"]");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"pitch_mark",&local_229);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_208);
        return local_4;
      }
      break;
    case 0x74:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,pcVar1,&local_5e1);
      bVar3 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffda18._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_760);
        std::operator<<((ostream *)local_760,"The argument for the -t option must be numeric");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_780,"pitch_mark",&local_781);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_780);
        std::allocator<char>::~allocator((allocator<char> *)&local_781);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_760);
        return local_4;
      }
      break;
    case 0x75:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_978,pcVar1,&local_979);
      bVar3 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffda18._M_current,
                         (double *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      std::__cxx11::string::~string(local_978);
      std::allocator<char>::~allocator((allocator<char> *)&local_979);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_af8);
        std::operator<<((ostream *)local_af8,"The argument for the -u option must be a number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b18,"pitch_mark",&local_b19);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_b18);
        std::allocator<char>::~allocator((allocator<char> *)&local_b19);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af8);
        return local_4;
      }
    }
  }
  local_b28 = local_18 * 1000.0;
  if (local_b28 * 0.5 <= local_28) {
    std::__cxx11::ostringstream::ostringstream(local_ca0);
    std::operator<<((ostream *)local_ca0,
                    "Upper fundamental frequency must be less than Nyquist frequency");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_cc0,"pitch_mark",&local_cc1);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
    std::__cxx11::string::~string(local_cc0);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_ca0);
    return local_4;
  }
  if (local_28 <= local_20) {
    std::__cxx11::ostringstream::ostringstream(local_e40);
    std::operator<<((ostream *)local_e40,"Lower fundamental frequency must be less than upper one");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e60,"pitch_mark",&local_e61);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
    std::__cxx11::string::~string(local_e60);
    std::allocator<char>::~allocator((allocator<char> *)&local_e61);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e40);
    return local_4;
  }
  local_e68 = local_8 - ya_optind;
  if (1 < local_e68) {
    std::__cxx11::ostringstream::ostringstream(local_fe0);
    std::operator<<((ostream *)local_fe0,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1000,"pitch_mark",&local_1001);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
    std::__cxx11::string::~string(local_1000);
    std::allocator<char>::~allocator((allocator<char> *)&local_1001);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_fe0);
    return local_4;
  }
  if (local_e68 == 0) {
    local_24f0 = (char *)0x0;
  }
  else {
    local_24f0 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_1010 = local_24f0;
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_1188);
    std::operator<<((ostream *)local_1188,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11a8,"pitch_mark",&local_11a9);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
    std::__cxx11::string::~string(local_11a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11a9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1188);
    return local_4;
  }
  std::ifstream::ifstream(local_13b8);
  pcVar1 = local_1010;
  if (local_1010 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_13b8,(_Ios_Openmode)pcVar1);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1530);
      poVar5 = std::operator<<((ostream *)local_1530,"Cannot open file ");
      std::operator<<(poVar5,local_1010);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1550,"pitch_mark",&local_1551);
      sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
      std::__cxx11::string::~string(local_1550);
      std::allocator<char>::~allocator((allocator<char> *)&local_1551);
      local_4 = 1;
      local_1558 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1530);
      goto LAB_00107411;
    }
  }
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    local_2538 = (char *)&std::cin;
  }
  else {
    local_2538 = local_13b8;
  }
  local_1560 = local_2538;
  sptk::PitchExtraction::PitchExtraction
            (in_stack_ffffffffffffda80,in_stack_ffffffffffffda7c,
             (double)CONCAT17(in_stack_ffffffffffffda77,in_stack_ffffffffffffda70),
             in_stack_ffffffffffffda68,
             (double)CONCAT44(in_stack_ffffffffffffda64,in_stack_ffffffffffffda60),
             in_stack_ffffffffffffda58,in_stack_ffffffffffffda54);
  bVar3 = sptk::PitchExtraction::IsValid
                    ((PitchExtraction *)
                     CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
  if (bVar3) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x1063f9);
    while( true ) {
      bVar3 = sptk::ReadStream<double>
                        (in_stack_ffffffffffffda18._M_current,
                         (istream *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
      iVar10 = (int)((ulong)in_stack_ffffffffffffda58 >> 0x20);
      if (!bVar3) break;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffda20._M_current,
                 in_stack_ffffffffffffda18._M_current);
    }
    bVar3 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_ffffffffffffda20._M_current);
    if (bVar3) {
      local_4 = 0;
      local_1558 = 1;
    }
    else {
      local_254a = false;
      if ((local_34 != 0) && (local_254a = false, local_34 != 1)) {
        local_254a = local_34 != 2;
      }
      local_1731 = local_254a;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1064e2);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1064ef);
      bVar3 = sptk::PitchExtraction::Run
                        ((PitchExtraction *)
                         CONCAT44(in_stack_ffffffffffffda2c,in_stack_ffffffffffffda28),
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_ffffffffffffda20._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_ffffffffffffda18._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10),
                         (Polarity *)in_stack_ffffffffffffda08);
      if (bVar3) {
        if (local_34 != 1) {
          local_1918 = (double *)
                       std::vector<double,_std::allocator<double>_>::begin
                                 ((vector<double,_std::allocator<double>_> *)
                                  in_stack_ffffffffffffda08);
          local_1920 = (double *)
                       std::vector<double,_std::allocator<double>_>::end
                                 ((vector<double,_std::allocator<double>_> *)
                                  in_stack_ffffffffffffda08);
          local_1928 = (double *)
                       std::vector<double,_std::allocator<double>_>::begin
                                 ((vector<double,_std::allocator<double>_> *)
                                  in_stack_ffffffffffffda08);
          local_1930 = local_b28;
          __first._M_current._4_4_ = in_stack_ffffffffffffda2c;
          __first._M_current._0_4_ = in_stack_ffffffffffffda28;
          __unary_op.sampling_rate_in_hz._7_1_ = in_stack_ffffffffffffda17;
          __unary_op.sampling_rate_in_hz._0_7_ = in_stack_ffffffffffffda10;
          local_1938 = (double *)
                       std::
                       transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__0>
                                 (__first,in_stack_ffffffffffffda20,in_stack_ffffffffffffda18,
                                  __unary_op);
        }
        if (local_176c == 0) {
          std::__cxx11::ostringstream::ostringstream(local_1ab0);
          std::operator<<((ostream *)local_1ab0,"Failed to detect polarity");
          paVar9 = &local_1ad1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1ad0,"pitch_mark",paVar9);
          sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
          std::__cxx11::string::~string(local_1ad0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1ad1);
          local_4 = 1;
          local_1558 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1ab0);
        }
        else {
          local_1ae0 = *(undefined8 *)(&DAT_00160068 + (ulong)(local_176c == 1) * 8);
          sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_1728);
          local_1ae4 = (int)sVar6;
          sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_1768);
          local_1ae8 = (int)sVar6;
          if (local_34 == 0) {
            bVar3 = std::vector<double,_std::allocator<double>_>::empty
                              ((vector<double,_std::allocator<double>_> *)
                               in_stack_ffffffffffffda20._M_current);
            if (bVar3) {
              local_2588 = -1;
            }
            else {
              pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_1768,0);
              dVar8 = round(*pvVar7);
              local_2588 = (int)dVar8;
            }
            local_1aec = local_2588;
            local_1af4 = 1;
            for (local_1af0 = 0; local_1af0 < local_1ae4; local_1af0 = local_1af0 + 1) {
              if (local_1af0 == local_1aec) {
                bVar3 = sptk::WriteStream<double>
                                  ((double)in_stack_ffffffffffffda08,(ostream *)0x106989);
                if (!bVar3) {
                  std::__cxx11::ostringstream::ostringstream(local_1c70);
                  std::operator<<((ostream *)local_1c70,"Failed to write pitch mark");
                  paVar9 = &local_1c91;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_1c90,"pitch_mark",paVar9);
                  sptk::PrintErrorMessage
                            ((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
                  std::__cxx11::string::~string(local_1c90);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1c91);
                  local_4 = 1;
                  local_1558 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_1c70);
                  goto LAB_0010739d;
                }
                if (local_1af4 < local_1ae8) {
                  sVar6 = (size_type)local_1af4;
                  local_1af4 = local_1af4 + 1;
                  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_1768,sVar6);
                  dVar8 = round(*pvVar7);
                  local_1aec = (int)dVar8;
                }
              }
              else {
                bVar3 = sptk::WriteStream<double>
                                  ((double)in_stack_ffffffffffffda08,(ostream *)0x106b0f);
                if (!bVar3) {
                  std::__cxx11::ostringstream::ostringstream(local_1e10);
                  std::operator<<((ostream *)local_1e10,"Failed to write pitch mark");
                  paVar9 = &local_1e31;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_1e30,"pitch_mark",paVar9);
                  sptk::PrintErrorMessage
                            ((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
                  std::__cxx11::string::~string(local_1e30);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1e31);
                  local_4 = 1;
                  local_1558 = 1;
                  std::__cxx11::ostringstream::~ostringstream(local_1e10);
                  goto LAB_0010739d;
                }
              }
            }
LAB_00107387:
            local_4 = 0;
            local_1558 = 1;
          }
          else if (local_34 - 1U < 2) {
            if ((local_1ae8 < 1) ||
               (bVar3 = sptk::WriteStream<double>
                                  (in_stack_ffffffffffffda60,iVar10,
                                   (vector<double,_std::allocator<double>_> *)
                                   CONCAT44(in_stack_ffffffffffffda54,in_stack_ffffffffffffda50),
                                   in_stack_ffffffffffffda48,
                                   (int *)CONCAT44(in_stack_ffffffffffffda44,
                                                   in_stack_ffffffffffffda40)), bVar3))
            goto LAB_00107387;
            std::__cxx11::ostringstream::ostringstream(local_1fb0);
            std::operator<<((ostream *)local_1fb0,"Failed to write pitch mark");
            paVar9 = &local_1fd1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1fd0,"pitch_mark",paVar9);
            sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
            std::__cxx11::string::~string(local_1fd0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1fd1);
            local_4 = 1;
            local_1558 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1fb0);
          }
          else {
            if (local_34 - 3U < 3) {
              local_1fdc = 0;
              for (local_1fd8 = 0; local_1fd8 <= local_1ae8; local_1fd8 = local_1fd8 + 1) {
                iVar10 = local_1ae4;
                if (local_1fd8 < local_1ae8) {
                  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_1768,(long)local_1fd8);
                  dVar8 = round(*pvVar7);
                  iVar10 = (int)dVar8;
                }
                local_1fe0 = iVar10;
                for (local_1fe4 = local_1fdc; local_1fe4 < local_1fe0; local_1fe4 = local_1fe4 + 1)
                {
                  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (&local_1750,(long)local_1fe4);
                  if ((*pvVar7 == 0.0) && (!NAN(*pvVar7))) break;
                }
                if (local_1fdc < local_1fe4) {
                  local_2000 = (double *)
                               std::vector<double,_std::allocator<double>_>::begin
                                         ((vector<double,_std::allocator<double>_> *)
                                          in_stack_ffffffffffffda08);
                  local_1ff8 = (double *)
                               __gnu_cxx::
                               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               ::operator+(in_stack_ffffffffffffda18._M_current,
                                           CONCAT17(in_stack_ffffffffffffda17,
                                                    in_stack_ffffffffffffda10));
                  local_2010 = (double *)
                               std::vector<double,_std::allocator<double>_>::begin
                                         ((vector<double,_std::allocator<double>_> *)
                                          in_stack_ffffffffffffda08);
                  local_2008 = (double *)
                               __gnu_cxx::
                               __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                               ::operator+(in_stack_ffffffffffffda18._M_current,
                                           CONCAT17(in_stack_ffffffffffffda17,
                                                    in_stack_ffffffffffffda10));
                  local_1ff0 = std::
                               accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                                         (in_stack_ffffffffffffda20,in_stack_ffffffffffffda18,
                                          (double)CONCAT17(in_stack_ffffffffffffda17,
                                                           in_stack_ffffffffffffda10));
                  local_2018 = (string *)(6.283185307179586 / local_1ff0);
                  local_2020 = 0.0;
                  for (local_2024 = local_1fdc; local_2024 < local_1fe4; local_2024 = local_2024 + 1
                      ) {
                    if (local_34 == 3) {
                      local_2030 = sin(local_2020);
                    }
                    else if (local_34 == 4) {
                      local_2030 = cos(local_2020);
                    }
                    else {
                      if (local_34 != 5) {
                        local_4 = 1;
                        local_1558 = 1;
                        goto LAB_0010739d;
                      }
                      dVar8 = fmod(local_2020,6.283185307179586);
                      local_2030 = dVar8 / 3.141592653589793 - 1.0;
                    }
                    bVar3 = sptk::WriteStream<double>
                                      ((double)in_stack_ffffffffffffda08,(ostream *)0x107046);
                    if (!bVar3) {
                      std::__cxx11::ostringstream::ostringstream(local_21a8);
                      std::operator<<((ostream *)local_21a8,"Failed to write periodic sequence");
                      in_stack_ffffffffffffda20._M_current = (double *)&local_21c9;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_21c8,"pitch_mark",
                                 (allocator *)in_stack_ffffffffffffda20._M_current);
                      sptk::PrintErrorMessage
                                ((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
                      std::__cxx11::string::~string(local_21c8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_21c9);
                      local_4 = 1;
                      local_1558 = 1;
                      std::__cxx11::ostringstream::~ostringstream(local_21a8);
                      goto LAB_0010739d;
                    }
                    in_stack_ffffffffffffda18._M_current = (double *)local_2018;
                    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                                       (&local_1750,(long)local_2024);
                    local_2020 = (double)in_stack_ffffffffffffda18._M_current * *pvVar7 + local_2020
                    ;
                  }
                }
                for (local_21d0 = local_1fe4; local_21d0 < local_1fe0; local_21d0 = local_21d0 + 1)
                {
                  in_stack_ffffffffffffda17 =
                       sptk::WriteStream<double>
                                 ((double)in_stack_ffffffffffffda08,(ostream *)0x107208);
                  if (!(bool)in_stack_ffffffffffffda17) {
                    std::__cxx11::ostringstream::ostringstream(local_2348);
                    std::operator<<((ostream *)local_2348,"Failed to write periodic sequence");
                    paVar9 = &local_2369;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_2368,"pitch_mark",paVar9);
                    sptk::PrintErrorMessage
                              ((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
                    std::__cxx11::string::~string(local_2368);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2369);
                    local_4 = 1;
                    local_1558 = 1;
                    std::__cxx11::ostringstream::~ostringstream(local_2348);
                    goto LAB_0010739d;
                  }
                }
                local_1fdc = local_1fe0;
              }
              goto LAB_00107387;
            }
            local_4 = 1;
            local_1558 = 1;
          }
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_18e8);
        std::operator<<((ostream *)local_18e8,"Failed to extract pitch mark");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1908,"pitch_mark",&local_1909);
        sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
        std::__cxx11::string::~string(local_1908);
        std::allocator<char>::~allocator((allocator<char> *)&local_1909);
        local_4 = 1;
        local_1558 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_18e8);
      }
LAB_0010739d:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffda20._M_current);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffda20._M_current);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffda20._M_current);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_16e8);
    std::operator<<((ostream *)local_16e8,"Failed to initialize PitchExtraction");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1708,"pitch_mark",&local_1709);
    sptk::PrintErrorMessage((string *)in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
    std::__cxx11::string::~string(local_1708);
    std::allocator<char>::~allocator((allocator<char> *)&local_1709);
    local_4 = 1;
    local_1558 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_16e8);
  }
  sptk::PitchExtraction::~PitchExtraction
            ((PitchExtraction *)CONCAT17(in_stack_ffffffffffffda17,in_stack_ffffffffffffda10));
LAB_00107411:
  std::ifstream::~ifstream(local_13b8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  double sampling_rate(kDefaultSamplingRate);
  double lower_f0(kDefaultLowerF0);
  double upper_f0(kDefaultUpperF0);
  double voicing_threshold(kDefaultVoicingThreshold);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:L:H:t:o:u:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        const double min(6.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= min || max < sampling_rate) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a number "
                        << "in the interval (" << min << ", " << max << "]";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_f0) ||
            lower_f0 <= 10.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a number "
                        << "greater than 10";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_f0) ||
            upper_f0 <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToDouble(optarg, &voicing_threshold)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be numeric";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (0.5 * sampling_rate_in_hz <= upper_f0) {
    std::ostringstream error_message;
    error_message
        << "Upper fundamental frequency must be less than Nyquist frequency";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (upper_f0 <= lower_f0) {
    std::ostringstream error_message;
    error_message << "Lower fundamental frequency must be less than upper one";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch_mark", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PitchExtraction pitch_extraction(
      1, sampling_rate_in_hz, lower_f0, upper_f0, voicing_threshold,
      sptk::PitchExtraction::Algorithms::kReaper);
  if (!pitch_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PitchExtraction";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::vector<double> waveform;
  {
    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  const bool waveform_output(kBinarySequence != output_format &&
                             kPositionInSeconds != output_format &&
                             kPositionInSamples != output_format);
  std::vector<double> f0;
  std::vector<double> pitch_mark;
  sptk::PitchExtractionInterface::Polarity polarity;
  if (!pitch_extraction.Run(waveform, waveform_output ? &f0 : NULL, &pitch_mark,
                            &polarity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract pitch mark";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (kPositionInSeconds != output_format) {
    std::transform(
        pitch_mark.begin(), pitch_mark.end(), pitch_mark.begin(),
        [sampling_rate_in_hz](double x) { return x * sampling_rate_in_hz; });
  }

  if (sptk::PitchExtractionInterface::Polarity::kUnknown == polarity) {
    std::ostringstream error_message;
    error_message << "Failed to detect polarity";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const double binary_polarity(
      sptk::PitchExtractionInterface::Polarity::kPositive == polarity ? 1.0
                                                                      : -1.0);
  const int waveform_length(static_cast<int>(waveform.size()));
  const int num_pitch_marks(static_cast<int>(pitch_mark.size()));

  switch (output_format) {
    case kBinarySequence: {
      int next_pitch_mark(pitch_mark.empty()
                              ? -1
                              : static_cast<int>(std::round(pitch_mark[0])));
      for (int i(0), j(1); i < waveform_length; ++i) {
        if (i == next_pitch_mark) {
          if (!sptk::WriteStream(binary_polarity, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
          if (j < num_pitch_marks) {
            next_pitch_mark = static_cast<int>(std::round(pitch_mark[j++]));
          }
        } else {
          if (!sptk::WriteStream(0.0, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }
      }
      break;
    }
    case kPositionInSeconds:
    case kPositionInSamples: {
      if (0 < num_pitch_marks &&
          !sptk::WriteStream(0, num_pitch_marks, pitch_mark, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write pitch mark";
        sptk::PrintErrorMessage("pitch_mark", error_message);
        return 1;
      }
      break;
    }
    case kSine:
    case kCosine:
    case kSawtooth: {
      for (int n(0), i(0); n <= num_pitch_marks; ++n) {
        const int next_pitch_mark(
            n < num_pitch_marks ? static_cast<int>(std::round(pitch_mark[n]))
                                : waveform_length);
        // Find the point across voiced region to unvoiced one.
        int j(i);
        for (; j < next_pitch_mark; ++j) {
          if (0.0 == f0[j]) {
            break;
          }
        }

        // Output periodic sequence.
        if (i < j) {
          const double sum_f0(
              std::accumulate(f0.begin() + i, f0.begin() + j, 0.0));
          const double multiplier(sptk::kTwoPi / sum_f0);

          double phase(0.0);
          for (int k(i); k < j; ++k) {
            double value;
            switch (output_format) {
              case kSine: {
                value = std::sin(phase);
                break;
              }
              case kCosine: {
                value = std::cos(phase);
                break;
              }
              case kSawtooth: {
                value = std::fmod(phase, sptk::kTwoPi) / sptk::kPi - 1.0;
                break;
              }
              default: {
                return 1;
              }
            }
            if (!sptk::WriteStream(binary_polarity * value, &std::cout)) {
              std::ostringstream error_message;
              error_message << "Failed to write periodic sequence";
              sptk::PrintErrorMessage("pitch_mark", error_message);
              return 1;
            }
            phase += multiplier * f0[k];
          }
        }

        // Output unvoiced sequence.
        for (int k(j); k < next_pitch_mark; ++k) {
          if (!sptk::WriteStream(unvoiced_value, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write periodic sequence";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }

        i = next_pitch_mark;
      }
      break;
    }
    default: {
      return 1;
    }
  }

  return 0;
}